

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

void __thiscall doublechecked::Roaring::Roaring(Roaring *this,Roaring *r)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in_RSI;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  
  roaring::Roaring::Roaring((Roaring *)in_RSI);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x11019b);
  roaring::Roaring::operator=((Roaring *)in_RSI,(Roaring *)in_RDI);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            (in_RSI,in_RDI);
  return;
}

Assistant:

Roaring(Roaring &&r) noexcept {
        plain = std::move(r.plain);
        check = std::move(r.check);
    }